

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O3

int Abc_NtkCheckSingleInstance(Abc_Ntk_t *pNtk)

{
  int iVar1;
  void **ppvVar2;
  void *pvVar3;
  Abc_Obj_t *pObj;
  void *pvVar4;
  char *pcVar5;
  char *pcVar6;
  Abc_Des_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  
  pAVar7 = pNtk->pDesign;
  iVar10 = 1;
  if (pAVar7 != (Abc_Des_t *)0x0) {
    pVVar8 = pAVar7->vModules;
    iVar1 = pVVar8->nSize;
    if (0 < (long)iVar1) {
      ppvVar2 = pVVar8->pArray;
      lVar11 = 0;
      do {
        *(undefined4 *)((long)ppvVar2[lVar11] + 0xc0) = 0;
        lVar11 = lVar11 + 1;
      } while (iVar1 != lVar11);
      if (0 < iVar1) {
        iVar10 = 1;
        lVar11 = 0;
        do {
          pvVar3 = pVVar8->pArray[lVar11];
          lVar9 = *(long *)((long)pvVar3 + 0x50);
          if (0 < *(int *)(lVar9 + 4)) {
            lVar12 = 0;
            do {
              pObj = *(Abc_Obj_t **)(*(long *)(lVar9 + 8) + lVar12 * 8);
              pvVar4 = (pObj->field_5).pData;
              if (pvVar4 != (void *)0x0) {
                if (0 < *(int *)((long)pvVar4 + 0x80)) {
                  iVar10 = 0;
                  printf("Network \"%s\" contains %d flops.\n",pNtk->pName);
                }
                if (*(int *)((long)pvVar4 + 0xc0) != 0) {
                  pcVar5 = pNtk->pName;
                  pcVar6 = Abc_ObjName(pObj);
                  iVar10 = 0;
                  printf("Network \"%s\" contains box \"%s\" whose model \"%s\" is instantiated more than once.\n"
                         ,pcVar5,pcVar6,*(undefined8 *)((long)pvVar4 + 8));
                }
                *(undefined4 *)((long)pvVar4 + 0xc0) = 1;
                lVar9 = *(long *)((long)pvVar3 + 0x50);
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < *(int *)(lVar9 + 4));
            pAVar7 = pNtk->pDesign;
          }
          lVar11 = lVar11 + 1;
          pVVar8 = pAVar7->vModules;
          iVar1 = pVVar8->nSize;
        } while (lVar11 < iVar1);
        if (0 < iVar1) {
          ppvVar2 = pVVar8->pArray;
          lVar11 = 0;
          do {
            *(undefined4 *)((long)ppvVar2[lVar11] + 0xc0) = 0;
            lVar11 = lVar11 + 1;
          } while (iVar1 != lVar11);
        }
      }
    }
  }
  return iVar10;
}

Assistant:

int Abc_NtkCheckSingleInstance( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pTemp, * pModel;
    Abc_Obj_t * pBox;
    int i, k, RetValue = 1;
    if ( pNtk->pDesign == NULL )
        return 1;
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pTemp, i )
        pTemp->fHieVisited = 0;
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pTemp, i )
        Abc_NtkForEachBox( pTemp, pBox, k )
        {
            pModel = (Abc_Ntk_t *)pBox->pData;
            if ( pModel == NULL )
                continue;
            if ( Abc_NtkLatchNum(pModel) > 0 )
            {
                printf( "Network \"%s\" contains %d flops.\n",                     
                    Abc_NtkName(pNtk), Abc_NtkLatchNum(pModel) );
                RetValue = 0;
            }
            if ( pModel->fHieVisited )
            {
                printf( "Network \"%s\" contains box \"%s\" whose model \"%s\" is instantiated more than once.\n", 
                    Abc_NtkName(pNtk), Abc_ObjName(pBox), Abc_NtkName(pModel) );
                RetValue = 0;
            }
            pModel->fHieVisited = 1;
        }